

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void buf2buf(size_t chunksize_src,void *buf_src,size_t chunksize_dst,void *buf_dst)

{
  void *in_RCX;
  ulong in_RDX;
  void *in_RSI;
  ulong in_RDI;
  
  if (in_RDX == in_RDI) {
    memcpy(in_RCX,in_RSI,in_RDI);
  }
  else if (in_RDX < in_RDI) {
    memcpy(in_RCX,(void *)((long)in_RSI + (in_RDI - in_RDX)),in_RDX);
  }
  else {
    memset(in_RCX,0,in_RDX - in_RDI);
    memcpy((void *)((long)in_RCX + (in_RDX - in_RDI)),in_RSI,in_RDI);
  }
  return;
}

Assistant:

void buf2buf(size_t chunksize_src, void *buf_src,
             size_t chunksize_dst, void *buf_dst)
{
    if (chunksize_dst == chunksize_src) {
        memcpy(buf_dst, buf_src, chunksize_src);
    } else if (chunksize_dst < chunksize_src) {
        memcpy(buf_dst, (uint8_t*)buf_src + (chunksize_src - chunksize_dst),
               chunksize_dst);
    } else { // chunksize_dst > chunksize_src
        memset(buf_dst, 0x0, chunksize_dst - chunksize_src);
        memcpy((uint8_t*)buf_dst + (chunksize_dst - chunksize_src),
               buf_src, chunksize_src);
    }
}